

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

void __thiscall
OpenMD::SelectionEvaluator::withinInstruction
          (SelectionEvaluator *this,Token *instruction,SelectionSet *bs,int frame)

{
  _func_void__Op_any_ptr__Arg_ptr *p_Var1;
  char *pcVar2;
  int iVar3;
  type_info *ptVar4;
  float *pfVar5;
  int *piVar6;
  float fVar7;
  any withinSpec;
  _Arg __arg;
  any local_78;
  _Arg local_68;
  pointer pOStack_60;
  pointer local_58 [2];
  SelectionSet local_48;
  
  local_78._M_storage._M_ptr = (void *)0x0;
  p_Var1 = (instruction->value)._M_manager;
  if (p_Var1 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    local_78._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  else {
    local_68._M_obj = &local_78;
    (*p_Var1)(_Op_clone,&instruction->value,&local_68);
  }
  ptVar4 = std::any::type(&local_78);
  pcVar2 = *(char **)(ptVar4 + 8);
  if (pcVar2 == _seekoff) {
LAB_0025f1e8:
    pfVar5 = (float *)std::__any_caster<float>(&local_78);
    if (pfVar5 == (float *)0x0) goto LAB_0025f296;
    fVar7 = *pfVar5;
    goto LAB_0025f214;
  }
  if (*pcVar2 != '*') {
    iVar3 = strcmp(pcVar2,_seekoff);
    if (iVar3 == 0) goto LAB_0025f1e8;
  }
  ptVar4 = std::any::type(&local_78);
  pcVar2 = *(char **)(ptVar4 + 8);
  if (pcVar2 == _put) {
LAB_0025f1ff:
    piVar6 = (int *)std::__any_caster<int>(&local_78);
    if (piVar6 == (int *)0x0) {
LAB_0025f296:
      std::__throw_bad_any_cast();
    }
    fVar7 = (float)*piVar6;
  }
  else {
    if (*pcVar2 != '*') {
      iVar3 = strcmp(pcVar2,_put);
      if (iVar3 == 0) goto LAB_0025f1ff;
    }
    local_68._M_obj = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"casting error in withinInstruction","");
    snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_68._M_obj);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((pointer *)local_68._M_obj != local_58) {
      operator_delete(local_68._M_obj,(long)local_58[0] + 1);
    }
    SelectionSet::clearAll(bs);
    fVar7 = 0.0;
  }
LAB_0025f214:
  DistanceFinder::find(&local_48,&this->distanceFinder,bs,(double)fVar7,frame);
  local_58[0] = (bs->bitsets_).
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  (bs->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68 = (_Arg)(bs->bitsets_).
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  pOStack_60 = (bs->bitsets_).
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  (bs->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_48.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_start;
  (bs->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_48.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_68);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_48.bitsets_);
  if (local_78._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_78._M_manager)(_Op_destroy,&local_78,(_Arg *)0x0);
  }
  return;
}

Assistant:

void SelectionEvaluator::withinInstruction(const Token& instruction,
                                             SelectionSet& bs, int frame) {
    std::any withinSpec = instruction.value;
    float distance(0.0);
    if (withinSpec.type() == typeid(float)) {
      distance = std::any_cast<float>(withinSpec);
    } else if (withinSpec.type() == typeid(int)) {
      distance = std::any_cast<int>(withinSpec);
    } else {
      evalError("casting error in withinInstruction");
      bs.clearAll();
    }

    bs = distanceFinder.find(bs, distance, frame);
  }